

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O2

void expression_eval(FILE *out,char *valueIn,_Bool returnString)

{
  int iVar1;
  char *pcVar2;
  s_pattern_match *psVar3;
  pattern_analyse_t *ppVar4;
  undefined7 in_register_00000011;
  long lVar5;
  long lVar6;
  char *__s;
  size_t __n;
  pattern_match_t *ppVar7;
  long lVar8;
  undefined8 uStack_90;
  pattern_analyse_t local_80;
  undefined8 local_78;
  undefined4 local_6c;
  regmatch_t local_68;
  int local_60;
  int local_5c;
  char *local_50;
  FILE *local_48;
  pattern_match_t *local_40;
  pattern_match_t *local_38;
  
  local_80.hasEquation = false;
  local_80.hasOperator = false;
  local_80.hasString = false;
  local_80.hasVariable = false;
  local_80.hasInt = false;
  local_80.hasFloat = false;
  if ((*valueIn != '$') || (valueIn[1] != '{')) {
    return;
  }
  local_6c = (undefined4)CONCAT71(in_register_00000011,returnString);
  local_48 = out;
  local_50 = strdup(valueIn);
  __s = local_50 + 2;
  pcVar2 = strchr(__s,0x7d);
  *pcVar2 = '\0';
  psVar3 = (pattern_match_t *)0x0;
  ppVar7 = psVar3;
  do {
    local_40 = ppVar7;
    ppVar7 = local_40;
    iVar1 = regexec((regex_t *)&regexFloat,__s,2,&local_68,0);
    local_38 = psVar3;
    if (iVar1 == 0) {
      ppVar4 = (pattern_analyse_t *)&local_80.hasFloat;
      uStack_90 = 1;
      goto LAB_00105028;
    }
    iVar1 = regexec((regex_t *)&regexInt,__s,2,&local_68,0);
    if (iVar1 == 0) {
      local_78 = 0;
      ppVar4 = (pattern_analyse_t *)&local_80.hasInt;
      lVar5 = 0;
LAB_00105040:
      ppVar4->hasString = true;
    }
    else {
      iVar1 = regexec((regex_t *)&regexString,__s,2,&local_68,0);
      ppVar4 = &local_80;
      lVar5 = 1;
      local_78 = 2;
      if (iVar1 == 0) goto LAB_00105040;
      iVar1 = regexec((regex_t *)&regexEquation,__s,2,&local_68,0);
      if (iVar1 == 0) {
        ppVar4 = (pattern_analyse_t *)&local_80.hasEquation;
        uStack_90 = 4;
LAB_00105028:
        lVar5 = 0;
        local_78 = uStack_90;
        goto LAB_00105040;
      }
      iVar1 = regexec((regex_t *)&regexOperator,__s,2,&local_68,0);
      if (iVar1 == 0) {
        ppVar4 = (pattern_analyse_t *)&local_80.hasOperator;
        uStack_90 = 5;
        goto LAB_00105028;
      }
      iVar1 = regexec((regex_t *)&regexVariable,__s,2,&local_68,0);
      if (iVar1 == 0) {
        ppVar4 = (pattern_analyse_t *)&local_80.hasVariable;
        uStack_90 = 3;
        goto LAB_00105028;
      }
      iVar1 = regexec((regex_t *)&regexPopen,__s,2,&local_68,0);
      if (iVar1 == 0) {
        uStack_90 = 6;
      }
      else {
        iVar1 = regexec((regex_t *)&regexPclose,__s,2,&local_68,0);
        if (iVar1 == 0) {
          uStack_90 = 7;
        }
        else {
          iVar1 = regexec((regex_t *)&regexNot,__s,2,&local_68,0);
          if (iVar1 != 0) {
            iVar1 = regexec((regex_t *)&regexEmpty,__s,2,&local_68,0);
            if (iVar1 != 0) {
              free(ppVar7);
              ppVar7 = (pattern_match_t *)0x0;
            }
            pcVar2 = local_50;
            builder_generateCode(local_48,ppVar7,&local_80,SUB41(local_6c,0));
            free(pcVar2);
            expression_free(ppVar7);
            return;
          }
          uStack_90 = 8;
        }
      }
      lVar5 = 0;
      local_78 = uStack_90;
    }
    psVar3 = (s_pattern_match *)malloc(0x18);
    lVar8 = (long)local_5c;
    lVar6 = (long)local_60;
    __n = lVar8 - lVar6;
    pcVar2 = (char *)calloc(1,__n + 1);
    psVar3->string = pcVar2;
    strncpy(pcVar2,__s + lVar6,__n);
    psVar3->next = (s_pattern_match *)0x0;
    __s = __s + lVar8 + lVar5;
    psVar3->type = (pattern_type_t)local_78;
    ppVar7 = psVar3;
    if (local_40 != (pattern_match_t *)0x0) {
      local_38->next = psVar3;
      ppVar7 = local_40;
    }
  } while( true );
}

Assistant:

void expression_eval(FILE *out, char *valueIn, bool returnString) {
	pattern_analyse_t analysation;
	analysation.hasEquation = false;
	analysation.hasFloat = false;
	analysation.hasInt = false;
	analysation.hasOperator = false;
	analysation.hasString = false;
	analysation.hasVariable = false;

	char *tmp;
	if ( !strncmp(valueIn, "${", 2) ) {
		char *dup = strdup(valueIn);
		char *expr = dup;
		expr += 2;
		tmp = strchr(expr, '}');
		*tmp = '\0';

		pattern_match_t *matches = expression_extract(&analysation, expr);
		builder_generateCode(out, matches, &analysation, returnString);

		free(dup);
		expression_free(matches);
	}
}